

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall duckdb_re2::Regexp::Decref(Regexp *this)

{
  int iVar1;
  uint16_t uVar2;
  mapped_type_conflict2 *pmVar3;
  pair<std::_Rb_tree_iterator<std::pair<duckdb_re2::Regexp_*const,_int>_>,_std::_Rb_tree_iterator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
  pVar4;
  MutexLock l;
  Regexp *local_20;
  MutexLock local_18;
  
  if (this->ref_ == 0xffff) {
    MutexLock::MutexLock(&local_18,(Mutex *)ref_storage);
    local_20 = this;
    pmVar3 = std::
             map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
             ::operator[]((map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                           *)(ref_storage + 0x38),&local_20);
    iVar1 = *pmVar3 + -1;
    if (*pmVar3 < 0x10000) {
      this->ref_ = (uint16_t)iVar1;
      local_20 = this;
      pVar4 = std::
              _Rb_tree<duckdb_re2::Regexp_*,_std::pair<duckdb_re2::Regexp_*const,_int>,_std::_Select1st<std::pair<duckdb_re2::Regexp_*const,_int>_>,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
              ::equal_range((_Rb_tree<duckdb_re2::Regexp_*,_std::pair<duckdb_re2::Regexp_*const,_int>,_std::_Select1st<std::pair<duckdb_re2::Regexp_*const,_int>_>,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                             *)(ref_storage + 0x38),&local_20);
      std::
      _Rb_tree<duckdb_re2::Regexp_*,_std::pair<duckdb_re2::Regexp_*const,_int>,_std::_Select1st<std::pair<duckdb_re2::Regexp_*const,_int>_>,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
      ::_M_erase_aux((_Rb_tree<duckdb_re2::Regexp_*,_std::pair<duckdb_re2::Regexp_*const,_int>,_std::_Select1st<std::pair<duckdb_re2::Regexp_*const,_int>_>,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                      *)(ref_storage + 0x38),(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
    }
    else {
      local_20 = this;
      pmVar3 = std::
               map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
               ::operator[]((map<duckdb_re2::Regexp_*,_int,_std::less<duckdb_re2::Regexp_*>,_std::allocator<std::pair<duckdb_re2::Regexp_*const,_int>_>_>
                             *)(ref_storage + 0x38),&local_20);
      *pmVar3 = iVar1;
    }
    MutexLock::~MutexLock(&local_18);
  }
  else {
    uVar2 = this->ref_ - 1;
    this->ref_ = uVar2;
    if (uVar2 == 0) {
      Destroy(this);
      return;
    }
  }
  return;
}

Assistant:

void Regexp::Decref() {
  if (ref_ == kMaxRef) {
    // Ref count is stored in overflow map.
    MutexLock l(ref_mutex());
    int r = (*ref_map())[this] - 1;
    if (r < kMaxRef) {
      ref_ = static_cast<uint16_t>(r);
      ref_map()->erase(this);
    } else {
      (*ref_map())[this] = r;
    }
    return;
  }
  ref_--;
  if (ref_ == 0)
    Destroy();
}